

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluVerify3(word *pF,int nVars,If_Grp_t *g,If_Grp_t *g2,If_Grp_t *r,word BStruth,
                  word BStruth2,word FStruth)

{
  char cVar1;
  If_Grp_t *g_00;
  word *pTruth;
  byte bVar2;
  int iVar3;
  word (*pawVar4) [1024];
  word (*pIn) [1024];
  long lVar5;
  word BStruth_local;
  If_Grp_t *pIStack_12048;
  word *pwStack_12040;
  word pTTWire2 [1024];
  word pTTWire [1024];
  word pTTRes [1024];
  word pTTFans [6] [1024];
  
  bVar2 = g->nVars;
  BStruth_local = BStruth;
  if ((((char)bVar2 < '\x02') || (g2->nVars < '\x02')) || (r->nVars < '\x02')) {
    __assert_fail("g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x2a5,
                  "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
                 );
  }
  if (((bVar2 < 7) && ((byte)g2->nVars < 7)) && ((byte)r->nVars < 7)) {
    pwStack_12040 = pF;
    if (TruthAll[0][0] == 0) {
      If_CluInitTruthTables();
      bVar2 = g->nVars;
    }
    pawVar4 = pTTFans;
    for (lVar5 = 0; lVar5 < (char)bVar2; lVar5 = lVar5 + 1) {
      If_CluCopy(*pawVar4,TruthAll[g->pVars[lVar5]],nVars);
      pawVar4 = pawVar4 + 1;
    }
    pawVar4 = pTTFans;
    If_CluComposeLut(nVars,g,&BStruth_local,pawVar4,pTTWire);
    cVar1 = g2->nVars;
    for (lVar5 = 0; lVar5 < cVar1; lVar5 = lVar5 + 1) {
      If_CluCopy(*pawVar4,TruthAll[g2->pVars[lVar5]],nVars);
      pawVar4 = pawVar4 + 1;
    }
    pawVar4 = pTTFans;
    pIStack_12048 = g2;
    If_CluComposeLut(nVars,g2,&BStruth2,pawVar4,pTTWire2);
    cVar1 = r->nVars;
    for (lVar5 = 0; lVar5 < cVar1; lVar5 = lVar5 + 1) {
      iVar3 = (int)r->pVars[lVar5];
      if (iVar3 == nVars) {
        pIn = &pTTWire;
      }
      else if (nVars + 1 == iVar3) {
        pIn = &pTTWire2;
      }
      else {
        pIn = TruthAll + iVar3;
      }
      If_CluCopy(*pawVar4,*pIn,nVars);
      pawVar4 = pawVar4 + 1;
    }
    If_CluComposeLut(nVars,r,&FStruth,pTTFans,pTTRes);
    pTruth = pwStack_12040;
    iVar3 = If_CluEqual(pTTRes,pwStack_12040,nVars);
    if (iVar3 == 0) {
      printf("%d\n",nVars);
      Kit_DsdPrintFromTruth((uint *)&BStruth_local,(int)g->nVars);
      printf("    ");
      If_CluPrintGroup(g);
      g_00 = pIStack_12048;
      Kit_DsdPrintFromTruth((uint *)&BStruth2,(int)pIStack_12048->nVars);
      printf("    ");
      If_CluPrintGroup(g_00);
      Kit_DsdPrintFromTruth((uint *)&FStruth,(int)r->nVars);
      printf("    ");
      If_CluPrintGroup(r);
      Kit_DsdPrintFromTruth((uint *)pTTWire,nVars);
      putchar(10);
      Kit_DsdPrintFromTruth((uint *)pTTWire2,nVars);
      putchar(10);
      Kit_DsdPrintFromTruth((uint *)pTTRes,nVars);
      putchar(10);
      Kit_DsdPrintFromTruth((uint *)pTruth,nVars);
      putchar(10);
      puts("Verification FAILED!");
    }
    return;
  }
  __assert_fail("g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x2a6,
                "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
               );
}

Assistant:

void If_CluVerify3( word * pF, int nVars, If_Grp_t * g, If_Grp_t * g2, If_Grp_t * r, word BStruth, word BStruth2, word FStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTWire2[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2 );
    assert( g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < g2->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g2->pVars[i]], nVars );
    If_CluComposeLut( nVars, g2, &BStruth2, pTTFans, pTTWire2 );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else if ( r->pVars[i] == nVars + 1 )
            If_CluCopy( pTTFans[i], pTTWire2, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, &FStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "%d\n", nVars );
//        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)&BStruth, g->nVars );   printf( "    " ); If_CluPrintGroup(g);  // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&BStruth2, g2->nVars ); printf( "    " ); If_CluPrintGroup(g2); // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&FStruth, r->nVars );   printf( "    " ); If_CluPrintGroup(r);  // printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)pTTWire, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTWire2, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}